

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264.c
# Opt level: O2

int h264_vui_parameters(bitstream *str,h264_vui *vui)

{
  uint32_t *val;
  uint uVar1;
  undefined4 in_EAX;
  int iVar2;
  h264_hrd_parameters *phVar3;
  uint32_t ival;
  int iVar4;
  undefined4 uStack_38;
  uint32_t tmp;
  
  uStack_38 = in_EAX;
  iVar2 = vs_u(str,&vui->aspect_ratio_present_flag,1);
  if (iVar2 != 0) {
    return 1;
  }
  val = &vui->aspect_ratio_idc;
  if (vui->aspect_ratio_present_flag == 0) {
    iVar2 = vs_infer(str,val,0);
    if (iVar2 != 0) {
      return 1;
    }
LAB_0010248d:
    iVar2 = vs_infer(str,&vui->sar_width,0);
    if (iVar2 != 0) {
      return 1;
    }
    ival = 0;
  }
  else {
    iVar2 = vs_u(str,val,8);
    if (iVar2 != 0) {
      return 1;
    }
    uVar1 = *val;
    if ((ulong)uVar1 == 0xff) {
      iVar2 = vs_u(str,&vui->sar_width,0x10);
      if (iVar2 != 0) {
        return 1;
      }
      iVar2 = vs_u(str,&vui->sar_height,0x10);
      goto LAB_001024ef;
    }
    if (0x10 < uVar1) {
      fprintf(_stderr,"WARNING: unknown aspect_ratio_idc %d\n");
      goto LAB_0010248d;
    }
    iVar2 = vs_infer(str,&vui->sar_width,aspect_ratios[uVar1][0]);
    if (iVar2 != 0) {
      return 1;
    }
    ival = aspect_ratios[*val][1];
  }
  iVar2 = vs_infer(str,&vui->sar_width,ival);
LAB_001024ef:
  iVar4 = 1;
  if (iVar2 == 0) {
    iVar2 = vs_u(str,&vui->overscan_info_present_flag,1);
    iVar4 = 1;
    if (iVar2 == 0) {
      if ((vui->overscan_info_present_flag != 0) &&
         (iVar2 = vs_u(str,&vui->overscan_appropriate_flag,1), iVar2 != 0)) {
        return 1;
      }
      iVar2 = vs_u(str,&vui->video_signal_type_present_flag,1);
      iVar4 = 1;
      if (iVar2 == 0) {
        if (vui->video_signal_type_present_flag == 0) {
          iVar2 = vs_infer(str,&vui->video_format,5);
          if (iVar2 != 0) {
            return 1;
          }
          iVar2 = vs_infer(str,&vui->video_full_range_flag,0);
          if (iVar2 != 0) {
            return 1;
          }
          iVar2 = vs_infer(str,&vui->colour_description_present_flag,0);
        }
        else {
          iVar2 = vs_u(str,&vui->video_format,3);
          if (iVar2 != 0) {
            return 1;
          }
          iVar2 = vs_u(str,&vui->video_full_range_flag,1);
          if (iVar2 != 0) {
            return 1;
          }
          iVar2 = vs_u(str,&vui->colour_description_present_flag,1);
        }
        iVar4 = 1;
        if (iVar2 == 0) {
          if (vui->colour_description_present_flag == 0) {
            iVar2 = vs_infer(str,&vui->colour_primaries,2);
            if (iVar2 != 0) {
              return 1;
            }
            iVar2 = vs_infer(str,&vui->transfer_characteristics,2);
            if (iVar2 != 0) {
              return 1;
            }
            iVar2 = vs_infer(str,&vui->matrix_coefficients,2);
          }
          else {
            iVar2 = vs_u(str,&vui->colour_primaries,8);
            if (iVar2 != 0) {
              return 1;
            }
            iVar2 = vs_u(str,&vui->transfer_characteristics,8);
            if (iVar2 != 0) {
              return 1;
            }
            iVar2 = vs_u(str,&vui->matrix_coefficients,8);
          }
          iVar4 = 1;
          if (iVar2 == 0) {
            iVar2 = vs_u(str,&vui->chroma_loc_info_present_flag,1);
            iVar4 = 1;
            if (iVar2 == 0) {
              if (vui->chroma_loc_info_present_flag == 0) {
                iVar2 = vs_infer(str,&vui->chroma_sample_loc_type_top_field,0);
                if (iVar2 != 0) {
                  return 1;
                }
                iVar2 = vs_infer(str,&vui->chroma_sample_loc_type_bottom_field,0);
              }
              else {
                iVar2 = vs_ue(str,&vui->chroma_sample_loc_type_top_field);
                if (iVar2 != 0) {
                  return 1;
                }
                iVar2 = vs_ue(str,&vui->chroma_sample_loc_type_bottom_field);
              }
              if (iVar2 == 0) {
                iVar2 = vs_u(str,&vui->timing_info_present_flag,1);
                iVar4 = 1;
                if (iVar2 == 0) {
                  if (vui->timing_info_present_flag == 0) {
                    iVar2 = vs_infer(str,&vui->fixed_frame_rate_flag,0);
                  }
                  else {
                    iVar2 = vs_u(str,&vui->num_units_in_tick,0x20);
                    if (iVar2 != 0) {
                      return 1;
                    }
                    iVar2 = vs_u(str,&vui->time_scale,0x20);
                    if (iVar2 != 0) {
                      return 1;
                    }
                    iVar2 = vs_u(str,&vui->fixed_frame_rate_flag,1);
                  }
                  iVar4 = 1;
                  if (iVar2 == 0) {
                    _uStack_38 = (ulong)CONCAT14(vui->nal_hrd_parameters !=
                                                 (h264_hrd_parameters *)0x0,uStack_38);
                    iVar2 = vs_u(str,&tmp,1);
                    iVar4 = 1;
                    if (iVar2 == 0) {
                      if (tmp != 0) {
                        if (str->dir == VS_DECODE) {
                          phVar3 = (h264_hrd_parameters *)calloc(0x19c,1);
                          vui->nal_hrd_parameters = phVar3;
                        }
                        else {
                          phVar3 = vui->nal_hrd_parameters;
                        }
                        iVar2 = h264_hrd_parameters(str,phVar3);
                        if (iVar2 != 0) {
                          return 1;
                        }
                      }
                      _uStack_38 = (ulong)CONCAT14(vui->vcl_hrd_parameters !=
                                                   (h264_hrd_parameters *)0x0,uStack_38);
                      iVar2 = vs_u(str,&tmp,1);
                      iVar4 = 1;
                      if (iVar2 == 0) {
                        if (tmp != 0) {
                          if (str->dir == VS_DECODE) {
                            phVar3 = (h264_hrd_parameters *)calloc(0x19c,1);
                            vui->vcl_hrd_parameters = phVar3;
                          }
                          else {
                            phVar3 = vui->vcl_hrd_parameters;
                          }
                          iVar2 = h264_hrd_parameters(str,phVar3);
                          if (iVar2 != 0) {
                            return 1;
                          }
                        }
                        if (((vui->nal_hrd_parameters != (h264_hrd_parameters *)0x0) ||
                            (vui->vcl_hrd_parameters != (h264_hrd_parameters *)0x0)) &&
                           (iVar2 = vs_u(str,&vui->low_delay_hrd_flag,1), iVar2 != 0)) {
                          return 1;
                        }
                        iVar2 = vs_u(str,&vui->pic_struct_present_flag,1);
                        iVar4 = 1;
                        if (iVar2 == 0) {
                          iVar2 = vs_u(str,&vui->bitstream_restriction_present_flag,1);
                          iVar4 = 1;
                          if (iVar2 == 0) {
                            if (vui->bitstream_restriction_present_flag == 0) {
                              iVar2 = vs_infer(str,&vui->motion_vectors_over_pic_bounduaries_flag,1)
                              ;
                              if (iVar2 != 0) {
                                return 1;
                              }
                              iVar2 = vs_infer(str,&vui->max_bytes_per_pic_denom,2);
                              if (iVar2 != 0) {
                                return 1;
                              }
                              iVar2 = vs_infer(str,&vui->max_bits_per_mb_denom,1);
                              if (iVar2 != 0) {
                                return 1;
                              }
                              iVar2 = vs_infer(str,&vui->log2_max_mv_length_horizontal,0x10);
                              if (iVar2 != 0) {
                                return 1;
                              }
                              iVar2 = vs_infer(str,&vui->log2_max_mv_length_vertical,0x10);
                              if (iVar2 != 0) {
                                return 1;
                              }
                              iVar2 = vs_infer(str,&vui->num_reorder_frames,0x10);
                              if (iVar2 != 0) {
                                return 1;
                              }
                              iVar2 = vs_infer(str,&vui->max_dec_frame_buffering,0x10);
                            }
                            else {
                              iVar2 = vs_u(str,&vui->motion_vectors_over_pic_bounduaries_flag,1);
                              if (iVar2 != 0) {
                                return 1;
                              }
                              iVar2 = vs_ue(str,&vui->max_bytes_per_pic_denom);
                              if (iVar2 != 0) {
                                return 1;
                              }
                              iVar2 = vs_ue(str,&vui->max_bits_per_mb_denom);
                              if (iVar2 != 0) {
                                return 1;
                              }
                              iVar2 = vs_ue(str,&vui->log2_max_mv_length_horizontal);
                              if (iVar2 != 0) {
                                return 1;
                              }
                              iVar2 = vs_ue(str,&vui->log2_max_mv_length_vertical);
                              if (iVar2 != 0) {
                                return 1;
                              }
                              iVar2 = vs_ue(str,&vui->num_reorder_frames);
                              if (iVar2 != 0) {
                                return 1;
                              }
                              iVar2 = vs_ue(str,&vui->max_dec_frame_buffering);
                            }
                            iVar4 = 1;
                            if (iVar2 == 0) {
                              iVar4 = 0;
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

int h264_vui_parameters(struct bitstream *str, struct h264_vui *vui) {
	if (vs_u(str, &vui->aspect_ratio_present_flag, 1)) return 1;
	if (vui->aspect_ratio_present_flag) {
		if (vs_u(str, &vui->aspect_ratio_idc, 8)) return 1;
		if (vui->aspect_ratio_idc == 255) {
			if (vs_u(str, &vui->sar_width, 16)) return 1;
			if (vs_u(str, &vui->sar_height, 16)) return 1;
		} else {
			if (vui->aspect_ratio_idc < ARRAY_SIZE(aspect_ratios)) {
				if (vs_infer(str, &vui->sar_width, aspect_ratios[vui->aspect_ratio_idc][0])) return 1;
				if (vs_infer(str, &vui->sar_width, aspect_ratios[vui->aspect_ratio_idc][1])) return 1;
			} else {
				fprintf(stderr, "WARNING: unknown aspect_ratio_idc %d\n", vui->aspect_ratio_idc);
				if (vs_infer(str, &vui->sar_width, 0)) return 1;
				if (vs_infer(str, &vui->sar_width, 0)) return 1;
			}
		}
	} else {
		if (vs_infer(str, &vui->aspect_ratio_idc, 0)) return 1;
		if (vs_infer(str, &vui->sar_width, 0)) return 1;
		if (vs_infer(str, &vui->sar_width, 0)) return 1;
	}
	if (vs_u(str, &vui->overscan_info_present_flag, 1)) return 1;
	if (vui->overscan_info_present_flag) {
		if (vs_u(str, &vui->overscan_appropriate_flag, 1)) return 1;
	}
	if (vs_u(str, &vui->video_signal_type_present_flag, 1)) return 1;
	if (vui->video_signal_type_present_flag) {
		if (vs_u(str, &vui->video_format, 3)) return 1;
		if (vs_u(str, &vui->video_full_range_flag, 1)) return 1;
		if (vs_u(str, &vui->colour_description_present_flag, 1)) return 1;
	} else {
		if (vs_infer(str, &vui->video_format, 5)) return 1;
		if (vs_infer(str, &vui->video_full_range_flag, 0)) return 1;
		if (vs_infer(str, &vui->colour_description_present_flag, 0)) return 1;
	}
	if (vui->colour_description_present_flag) {
		if (vs_u(str, &vui->colour_primaries, 8)) return 1;
		if (vs_u(str, &vui->transfer_characteristics, 8)) return 1;
		if (vs_u(str, &vui->matrix_coefficients, 8)) return 1;
	} else {
		if (vs_infer(str, &vui->colour_primaries, 2)) return 1;
		if (vs_infer(str, &vui->transfer_characteristics, 2)) return 1;
		if (vs_infer(str, &vui->matrix_coefficients, 2)) return 1;
	}
	if (vs_u(str, &vui->chroma_loc_info_present_flag, 1)) return 1;
	if (vui->chroma_loc_info_present_flag) {
		if (vs_ue(str, &vui->chroma_sample_loc_type_top_field)) return 1;
		if (vs_ue(str, &vui->chroma_sample_loc_type_bottom_field)) return 1;
	} else {
		if (vs_infer(str, &vui->chroma_sample_loc_type_top_field, 0)) return 1;
		if (vs_infer(str, &vui->chroma_sample_loc_type_bottom_field, 0)) return 1;
	}
	if (vs_u(str, &vui->timing_info_present_flag, 1)) return 1;
	if (vui->timing_info_present_flag) {
		if (vs_u(str, &vui->num_units_in_tick, 32)) return 1;
		if (vs_u(str, &vui->time_scale, 32)) return 1;
		if (vs_u(str, &vui->fixed_frame_rate_flag, 1)) return 1;
	} else {
		if (vs_infer(str, &vui->fixed_frame_rate_flag, 0)) return 1;
	}
	uint32_t tmp;
	tmp = !!vui->nal_hrd_parameters;
	if (vs_u(str, &tmp, 1)) return 1;
	if (tmp) {
		if (str->dir == VS_DECODE)
			vui->nal_hrd_parameters = calloc(sizeof *vui->nal_hrd_parameters, 1);
		if (h264_hrd_parameters(str, vui->nal_hrd_parameters)) return 1;
	}
	tmp = !!vui->vcl_hrd_parameters;
	if (vs_u(str, &tmp, 1)) return 1;
	if (tmp) {
		if (str->dir == VS_DECODE)
			vui->vcl_hrd_parameters = calloc(sizeof *vui->vcl_hrd_parameters, 1);
		if (h264_hrd_parameters(str, vui->vcl_hrd_parameters)) return 1;
	}
	if (vui->nal_hrd_parameters || vui->vcl_hrd_parameters) {
		if (vs_u(str, &vui->low_delay_hrd_flag, 1)) return 1;
	}
	if (vs_u(str, &vui->pic_struct_present_flag, 1)) return 1;
	if (vs_u(str, &vui->bitstream_restriction_present_flag, 1)) return 1;
	if (vui->bitstream_restriction_present_flag) {
		if (vs_u(str, &vui->motion_vectors_over_pic_bounduaries_flag, 1)) return 1;
		if (vs_ue(str, &vui->max_bytes_per_pic_denom)) return 1;
		if (vs_ue(str, &vui->max_bits_per_mb_denom)) return 1;
		if (vs_ue(str, &vui->log2_max_mv_length_horizontal)) return 1;
		if (vs_ue(str, &vui->log2_max_mv_length_vertical)) return 1;
		if (vs_ue(str, &vui->num_reorder_frames)) return 1;
		if (vs_ue(str, &vui->max_dec_frame_buffering)) return 1;
	} else {
		if (vs_infer(str, &vui->motion_vectors_over_pic_bounduaries_flag, 1)) return 1;
		if (vs_infer(str, &vui->max_bytes_per_pic_denom, 2)) return 1;
		if (vs_infer(str, &vui->max_bits_per_mb_denom, 1)) return 1;
		if (vs_infer(str, &vui->log2_max_mv_length_horizontal, 16)) return 1;
		if (vs_infer(str, &vui->log2_max_mv_length_vertical, 16)) return 1;
		/* XXX: not entirely correct */
		if (vs_infer(str, &vui->num_reorder_frames, 16)) return 1;
		if (vs_infer(str, &vui->max_dec_frame_buffering, 16)) return 1;
	}
	return 0;
}